

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_bias_test.cc
# Opt level: O1

void intgemm::kernel_add_bias_test<(intgemm::CPUType)1,short>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  short *psVar26;
  short sVar27;
  ulong uVar28;
  long lVar29;
  short sVar30;
  int iVar33;
  undefined1 auVar31 [16];
  int iVar34;
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar63;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar64;
  int iVar67;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar72 [16];
  AlignedVector<short> output;
  AlignedVector<short> bias;
  AlignedVector<short> input;
  AssertionHandler catchAssertionHandler;
  short local_10a;
  long local_108;
  ulong local_100;
  AlignedVector<short> local_f8;
  AlignedVector<short> local_e8;
  AlignedVector<short> local_d8;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  long local_a8;
  char *local_a0;
  size_t sStack_98;
  short *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  if (0 < kCPU) {
    AlignedVector<short>::AlignedVector(&local_d8,8,0x40);
    AlignedVector<short>::AlignedVector(&local_e8,8,0x40);
    AlignedVector<short>::AlignedVector(&local_f8,8,0x40);
    auVar25 = _DAT_001b7490;
    auVar24 = _DAT_001b7480;
    auVar23 = _DAT_001b7470;
    auVar22 = _DAT_001b10c0;
    auVar21 = _DAT_001b10b0;
    if (local_d8.size_ != 0) {
      uVar28 = local_d8.size_ + 0x7fffffffffffffff & 0x7fffffffffffffff;
      auVar31._8_4_ = (int)uVar28;
      auVar31._0_8_ = uVar28;
      auVar31._12_4_ = (int)(uVar28 >> 0x20);
      lVar29 = 0;
      auVar31 = auVar31 ^ _DAT_001b10c0;
      do {
        auVar46._8_4_ = (int)lVar29;
        auVar46._0_8_ = lVar29;
        auVar46._12_4_ = (int)((ulong)lVar29 >> 0x20);
        auVar38 = (auVar46 | auVar21) ^ auVar22;
        iVar54 = auVar31._0_4_;
        iVar64 = -(uint)(iVar54 < auVar38._0_4_);
        iVar33 = auVar31._4_4_;
        auVar39._4_4_ = -(uint)(iVar33 < auVar38._4_4_);
        iVar63 = auVar31._8_4_;
        iVar67 = -(uint)(iVar63 < auVar38._8_4_);
        iVar34 = auVar31._12_4_;
        auVar39._12_4_ = -(uint)(iVar34 < auVar38._12_4_);
        auVar56._4_4_ = iVar64;
        auVar56._0_4_ = iVar64;
        auVar56._8_4_ = iVar67;
        auVar56._12_4_ = iVar67;
        auVar68 = pshuflw(in_XMM11,auVar56,0xe8);
        auVar41._4_4_ = -(uint)(auVar38._4_4_ == iVar33);
        auVar41._12_4_ = -(uint)(auVar38._12_4_ == iVar34);
        auVar41._0_4_ = auVar41._4_4_;
        auVar41._8_4_ = auVar41._12_4_;
        auVar72 = pshuflw(in_XMM12,auVar41,0xe8);
        auVar39._0_4_ = auVar39._4_4_;
        auVar39._8_4_ = auVar39._12_4_;
        auVar69 = pshuflw(auVar68,auVar39,0xe8);
        auVar38._8_4_ = 0xffffffff;
        auVar38._0_8_ = 0xffffffffffffffff;
        auVar38._12_4_ = 0xffffffff;
        auVar38 = (auVar69 | auVar72 & auVar68) ^ auVar38;
        auVar38 = packssdw(auVar38,auVar38);
        sVar27 = (short)lVar29;
        if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[lVar29] = sVar27;
        }
        auVar39 = auVar41 & auVar56 | auVar39;
        auVar38 = packssdw(auVar39,auVar39);
        auVar69._8_4_ = 0xffffffff;
        auVar69._0_8_ = 0xffffffffffffffff;
        auVar69._12_4_ = 0xffffffff;
        auVar38 = packssdw(auVar38 ^ auVar69,auVar38 ^ auVar69);
        if ((auVar38._0_4_ >> 0x10 & 1) != 0) {
          local_d8.mem_[lVar29 + 1] = sVar27 + 1;
        }
        auVar38 = (auVar46 | auVar25) ^ auVar22;
        iVar64 = -(uint)(iVar54 < auVar38._0_4_);
        auVar65._4_4_ = -(uint)(iVar33 < auVar38._4_4_);
        iVar67 = -(uint)(iVar63 < auVar38._8_4_);
        auVar65._12_4_ = -(uint)(iVar34 < auVar38._12_4_);
        auVar40._4_4_ = iVar64;
        auVar40._0_4_ = iVar64;
        auVar40._8_4_ = iVar67;
        auVar40._12_4_ = iVar67;
        auVar55._4_4_ = -(uint)(auVar38._4_4_ == iVar33);
        auVar55._12_4_ = -(uint)(auVar38._12_4_ == iVar34);
        auVar55._0_4_ = auVar55._4_4_;
        auVar55._8_4_ = auVar55._12_4_;
        auVar65._0_4_ = auVar65._4_4_;
        auVar65._8_4_ = auVar65._12_4_;
        auVar38 = auVar55 & auVar40 | auVar65;
        auVar38 = packssdw(auVar38,auVar38);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar38 = packssdw(auVar38 ^ auVar1,auVar38 ^ auVar1);
        if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_d8.mem_[lVar29 + 2] = sVar27 + 2;
        }
        auVar41 = pshufhw(auVar40,auVar40,0x84);
        auVar56 = pshufhw(auVar55,auVar55,0x84);
        auVar39 = pshufhw(auVar41,auVar65,0x84);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar42 = (auVar39 | auVar56 & auVar41) ^ auVar42;
        auVar41 = packssdw(auVar42,auVar42);
        if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_d8.mem_[lVar29 + 3] = sVar27 + 3;
        }
        auVar41 = (auVar46 | auVar24) ^ auVar22;
        iVar64 = -(uint)(iVar54 < auVar41._0_4_);
        auVar44._4_4_ = -(uint)(iVar33 < auVar41._4_4_);
        iVar67 = -(uint)(iVar63 < auVar41._8_4_);
        auVar44._12_4_ = -(uint)(iVar34 < auVar41._12_4_);
        auVar57._4_4_ = iVar64;
        auVar57._0_4_ = iVar64;
        auVar57._8_4_ = iVar67;
        auVar57._12_4_ = iVar67;
        auVar38 = pshuflw(auVar38,auVar57,0xe8);
        auVar43._4_4_ = -(uint)(auVar41._4_4_ == iVar33);
        auVar43._12_4_ = -(uint)(auVar41._12_4_ == iVar34);
        auVar43._0_4_ = auVar43._4_4_;
        auVar43._8_4_ = auVar43._12_4_;
        in_XMM12 = pshuflw(auVar72 & auVar68,auVar43,0xe8);
        in_XMM12 = in_XMM12 & auVar38;
        auVar44._0_4_ = auVar44._4_4_;
        auVar44._8_4_ = auVar44._12_4_;
        auVar38 = pshuflw(auVar38,auVar44,0xe8);
        auVar68._8_4_ = 0xffffffff;
        auVar68._0_8_ = 0xffffffffffffffff;
        auVar68._12_4_ = 0xffffffff;
        auVar68 = (auVar38 | in_XMM12) ^ auVar68;
        in_XMM11 = packssdw(auVar68,auVar68);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[lVar29 + 4] = sVar27 + 4;
        }
        auVar44 = auVar43 & auVar57 | auVar44;
        auVar38 = packssdw(auVar44,auVar44);
        auVar72._8_4_ = 0xffffffff;
        auVar72._0_8_ = 0xffffffffffffffff;
        auVar72._12_4_ = 0xffffffff;
        auVar38 = packssdw(auVar38 ^ auVar72,auVar38 ^ auVar72);
        if ((auVar38 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          local_d8.mem_[lVar29 + 5] = sVar27 + 5;
        }
        auVar38 = (auVar46 | auVar23) ^ auVar22;
        iVar54 = -(uint)(iVar54 < auVar38._0_4_);
        auVar58._4_4_ = -(uint)(iVar33 < auVar38._4_4_);
        iVar63 = -(uint)(iVar63 < auVar38._8_4_);
        auVar58._12_4_ = -(uint)(iVar34 < auVar38._12_4_);
        auVar45._4_4_ = iVar54;
        auVar45._0_4_ = iVar54;
        auVar45._8_4_ = iVar63;
        auVar45._12_4_ = iVar63;
        auVar35._4_4_ = -(uint)(auVar38._4_4_ == iVar33);
        auVar35._12_4_ = -(uint)(auVar38._12_4_ == iVar34);
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar58._0_4_ = auVar58._4_4_;
        auVar58._8_4_ = auVar58._12_4_;
        auVar38 = auVar35 & auVar45 | auVar58;
        auVar38 = packssdw(auVar38,auVar38);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar38 = packssdw(auVar38 ^ auVar2,auVar38 ^ auVar2);
        if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_d8.mem_[lVar29 + 6] = sVar27 + 6;
        }
        auVar46 = pshufhw(auVar45,auVar45,0x84);
        auVar38 = pshufhw(auVar35,auVar35,0x84);
        auVar41 = pshufhw(auVar46,auVar58,0x84);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar38 = packssdw(auVar38 & auVar46,(auVar41 | auVar38 & auVar46) ^ auVar3);
        if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_d8.mem_[lVar29 + 7] = sVar27 + 7;
        }
        lVar29 = lVar29 + 8;
      } while ((uVar28 - ((uint)(local_d8.size_ + 0x7fffffffffffffff) & 7)) + 8 != lVar29);
    }
    auVar25 = _DAT_001b7490;
    auVar24 = _DAT_001b7480;
    auVar23 = _DAT_001b7470;
    auVar22 = _DAT_001b10c0;
    auVar21 = _DAT_001b10b0;
    if (local_e8.size_ != 0) {
      uVar28 = local_e8.size_ + 0x7fffffffffffffff & 0x7fffffffffffffff;
      auVar32._8_4_ = (int)uVar28;
      auVar32._0_8_ = uVar28;
      auVar32._12_4_ = (int)(uVar28 >> 0x20);
      lVar29 = 0;
      auVar32 = auVar32 ^ _DAT_001b10c0;
      do {
        auVar36._8_4_ = (int)lVar29;
        auVar36._0_8_ = lVar29;
        auVar36._12_4_ = (int)((ulong)lVar29 >> 0x20);
        auVar31 = (auVar36 | auVar21) ^ auVar22;
        iVar54 = auVar32._0_4_;
        iVar64 = -(uint)(iVar54 < auVar31._0_4_);
        iVar33 = auVar32._4_4_;
        auVar48._4_4_ = -(uint)(iVar33 < auVar31._4_4_);
        iVar63 = auVar32._8_4_;
        iVar67 = -(uint)(iVar63 < auVar31._8_4_);
        iVar34 = auVar32._12_4_;
        auVar48._12_4_ = -(uint)(iVar34 < auVar31._12_4_);
        auVar59._4_4_ = iVar64;
        auVar59._0_4_ = iVar64;
        auVar59._8_4_ = iVar67;
        auVar59._12_4_ = iVar67;
        auVar38 = pshuflw(in_XMM11,auVar59,0xe8);
        auVar47._4_4_ = -(uint)(auVar31._4_4_ == iVar33);
        auVar47._12_4_ = -(uint)(auVar31._12_4_ == iVar34);
        auVar47._0_4_ = auVar47._4_4_;
        auVar47._8_4_ = auVar47._12_4_;
        auVar46 = pshuflw(in_XMM12,auVar47,0xe8);
        auVar48._0_4_ = auVar48._4_4_;
        auVar48._8_4_ = auVar48._12_4_;
        auVar31 = pshuflw(auVar38,auVar48,0xe8);
        auVar70._8_4_ = 0xffffffff;
        auVar70._0_8_ = 0xffffffffffffffff;
        auVar70._12_4_ = 0xffffffff;
        auVar70 = (auVar31 | auVar46 & auVar38) ^ auVar70;
        auVar31 = packssdw(auVar70,auVar70);
        if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[lVar29] = 100;
        }
        auVar48 = auVar47 & auVar59 | auVar48;
        auVar31 = packssdw(auVar48,auVar48);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar4,auVar31 ^ auVar4);
        if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
          local_e8.mem_[lVar29 + 1] = 100;
        }
        auVar31 = (auVar36 | auVar25) ^ auVar22;
        iVar64 = -(uint)(iVar54 < auVar31._0_4_);
        auVar66._4_4_ = -(uint)(iVar33 < auVar31._4_4_);
        iVar67 = -(uint)(iVar63 < auVar31._8_4_);
        auVar66._12_4_ = -(uint)(iVar34 < auVar31._12_4_);
        auVar49._4_4_ = iVar64;
        auVar49._0_4_ = iVar64;
        auVar49._8_4_ = iVar67;
        auVar49._12_4_ = iVar67;
        auVar60._4_4_ = -(uint)(auVar31._4_4_ == iVar33);
        auVar60._12_4_ = -(uint)(auVar31._12_4_ == iVar34);
        auVar60._0_4_ = auVar60._4_4_;
        auVar60._8_4_ = auVar60._12_4_;
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar31 = auVar60 & auVar49 | auVar66;
        auVar31 = packssdw(auVar31,auVar31);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar5,auVar31 ^ auVar5);
        if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_e8.mem_[lVar29 + 2] = 100;
        }
        auVar41 = pshufhw(auVar49,auVar49,0x84);
        auVar56 = pshufhw(auVar60,auVar60,0x84);
        auVar39 = pshufhw(auVar41,auVar66,0x84);
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar50 = (auVar39 | auVar56 & auVar41) ^ auVar50;
        auVar41 = packssdw(auVar50,auVar50);
        if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_e8.mem_[lVar29 + 3] = 100;
        }
        auVar41 = (auVar36 | auVar24) ^ auVar22;
        iVar64 = -(uint)(iVar54 < auVar41._0_4_);
        auVar52._4_4_ = -(uint)(iVar33 < auVar41._4_4_);
        iVar67 = -(uint)(iVar63 < auVar41._8_4_);
        auVar52._12_4_ = -(uint)(iVar34 < auVar41._12_4_);
        auVar61._4_4_ = iVar64;
        auVar61._0_4_ = iVar64;
        auVar61._8_4_ = iVar67;
        auVar61._12_4_ = iVar67;
        auVar31 = pshuflw(auVar31,auVar61,0xe8);
        auVar51._4_4_ = -(uint)(auVar41._4_4_ == iVar33);
        auVar51._12_4_ = -(uint)(auVar41._12_4_ == iVar34);
        auVar51._0_4_ = auVar51._4_4_;
        auVar51._8_4_ = auVar51._12_4_;
        in_XMM12 = pshuflw(auVar46 & auVar38,auVar51,0xe8);
        in_XMM12 = in_XMM12 & auVar31;
        auVar52._0_4_ = auVar52._4_4_;
        auVar52._8_4_ = auVar52._12_4_;
        auVar31 = pshuflw(auVar31,auVar52,0xe8);
        auVar71._8_4_ = 0xffffffff;
        auVar71._0_8_ = 0xffffffffffffffff;
        auVar71._12_4_ = 0xffffffff;
        auVar71 = (auVar31 | in_XMM12) ^ auVar71;
        in_XMM11 = packssdw(auVar71,auVar71);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[lVar29 + 4] = 100;
        }
        auVar52 = auVar51 & auVar61 | auVar52;
        auVar31 = packssdw(auVar52,auVar52);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar6,auVar31 ^ auVar6);
        if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          local_e8.mem_[lVar29 + 5] = 100;
        }
        auVar31 = (auVar36 | auVar23) ^ auVar22;
        iVar54 = -(uint)(iVar54 < auVar31._0_4_);
        auVar62._4_4_ = -(uint)(iVar33 < auVar31._4_4_);
        iVar63 = -(uint)(iVar63 < auVar31._8_4_);
        auVar62._12_4_ = -(uint)(iVar34 < auVar31._12_4_);
        auVar53._4_4_ = iVar54;
        auVar53._0_4_ = iVar54;
        auVar53._8_4_ = iVar63;
        auVar53._12_4_ = iVar63;
        auVar37._4_4_ = -(uint)(auVar31._4_4_ == iVar33);
        auVar37._12_4_ = -(uint)(auVar31._12_4_ == iVar34);
        auVar37._0_4_ = auVar37._4_4_;
        auVar37._8_4_ = auVar37._12_4_;
        auVar62._0_4_ = auVar62._4_4_;
        auVar62._8_4_ = auVar62._12_4_;
        auVar31 = auVar37 & auVar53 | auVar62;
        auVar31 = packssdw(auVar31,auVar31);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar7,auVar31 ^ auVar7);
        if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_e8.mem_[lVar29 + 6] = 100;
        }
        auVar38 = pshufhw(auVar53,auVar53,0x84);
        auVar31 = pshufhw(auVar37,auVar37,0x84);
        auVar46 = pshufhw(auVar38,auVar62,0x84);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 & auVar38,(auVar46 | auVar31 & auVar38) ^ auVar8);
        if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_e8.mem_[lVar29 + 7] = 100;
        }
        lVar29 = lVar29 + 8;
      } while ((uVar28 - ((uint)(local_e8.size_ + 0x7fffffffffffffff) & 7)) + 8 != lVar29);
    }
    sVar27 = local_e8.mem_[1];
    sVar30 = local_e8.mem_[2];
    sVar9 = local_e8.mem_[3];
    sVar10 = local_e8.mem_[4];
    sVar11 = local_e8.mem_[5];
    sVar12 = local_e8.mem_[6];
    sVar13 = local_e8.mem_[7];
    sVar14 = local_d8.mem_[1];
    sVar15 = local_d8.mem_[2];
    sVar16 = local_d8.mem_[3];
    sVar17 = local_d8.mem_[4];
    sVar18 = local_d8.mem_[5];
    sVar19 = local_d8.mem_[6];
    sVar20 = local_d8.mem_[7];
    *local_f8.mem_ = *local_e8.mem_ + *local_d8.mem_;
    local_f8.mem_[1] = sVar27 + sVar14;
    local_f8.mem_[2] = sVar30 + sVar15;
    local_f8.mem_[3] = sVar9 + sVar16;
    local_f8.mem_[4] = sVar10 + sVar17;
    local_f8.mem_[5] = sVar11 + sVar18;
    local_f8.mem_[6] = sVar12 + sVar19;
    local_f8.mem_[7] = sVar13 + sVar20;
    if (local_f8.size_ != 0) {
      lVar29 = 0;
      local_100 = 0;
      do {
        local_b8._vptr_ITransientExpression = (_func_int **)0x1b3b11;
        local_b8.m_isBinaryExpression = true;
        local_b8.m_result = false;
        local_b8._10_6_ = 0;
        local_c8.file =
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/add_bias_test.cc"
        ;
        local_c8.line = 0x1d;
        Catch::StringRef::StringRef(&local_88,"output[i] == ElemType_(100 + i)");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)&local_b8,&local_c8,local_88,ContinueOnFailure);
        psVar26 = local_f8.mem_;
        sVar30 = (short)local_100 + 100;
        sVar27 = *(short *)((long)local_f8.mem_ + lVar29);
        local_10a = sVar30;
        local_108 = lVar29;
        Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
        lVar29 = local_108;
        local_b8.m_result = sVar30 == sVar27;
        local_b8.m_isBinaryExpression = true;
        local_a8 = (long)psVar26 + local_108;
        local_b8._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_001ed998;
        local_a0 = local_c8.file;
        sStack_98 = local_c8.line;
        local_90 = &local_10a;
        Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
        Catch::ITransientExpression::~ITransientExpression(&local_b8);
        Catch::AssertionHandler::complete(&local_78);
        if (local_78.m_completed == false) {
          (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_78.m_resultCapture,&local_78);
        }
        local_100 = local_100 + 1;
        lVar29 = lVar29 + 2;
      } while (local_100 < local_f8.size_);
    }
    free(local_f8.mem_);
    free(local_e8.mem_);
    free(local_d8.mem_);
  }
  return;
}

Assistant:

void kernel_add_bias_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static auto VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> bias(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));
  std::fill(bias.begin(), bias.end(), static_cast<ElemType_>(100));

  *output.template as<vec_t>() = kernels::add_bias(*input.template as<vec_t>(), bias.begin(), 0);
  for (std::size_t i = 0; i < output.size(); ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == static_cast<ElemType_>(bias[i] + input[i])); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(100 + i));
#endif
}